

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiWindow *pIVar4;
  ImGuiTable *table;
  ImVec2 IVar5;
  ImDrawList *draw_list;
  ImVec2 pos;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiID id;
  ImU32 IVar8;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *column;
  ImGuiTableColumn *pIVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar18;
  undefined8 in_XMM1_Qa;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ulong uVar22;
  ImRect IVar23;
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  bool local_fe;
  bool local_fd;
  float local_fc;
  ImGuiWindow *local_f8;
  char local_ec [4];
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [8];
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  float fStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_9c;
  undefined1 local_98 [16];
  long local_88;
  ImVec2 local_80;
  char *local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4->SkipItems == false) {
    table = GImGui->CurrentTable;
    if (table == (ImGuiTable *)0x0) {
      __assert_fail("table != __null && \"Need to call TableHeader() after BeginTable()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0xa9c,"void ImGui::TableHeader(const char *)");
    }
    iVar11 = table->CurrentColumn;
    lVar10 = (long)iVar11;
    if (lVar10 == -1) {
      __assert_fail("table->CurrentColumn != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0xa9d,"void ImGui::TableHeader(const char *)");
    }
    local_d8 = GImGui;
    if ((iVar11 < 0) ||
       (column = (table->Columns).Data + lVar10, (table->Columns).DataEnd <= column)) {
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                    ,0x20c,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pcVar12 = "";
    if (label != (char *)0x0) {
      pcVar12 = label;
    }
    local_78 = FindRenderedTextEnd(pcVar12,(char *)0x0);
    local_68 = CalcTextSize(pcVar12,local_78,true,-1.0);
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._0_4_ = local_68.x;
    local_98._4_4_ = local_68.y;
    local_98._12_4_ = extraout_XMM0_Dd;
    IVar5 = (pIVar4->DC).CursorPos;
    local_70 = IVar5;
    IVar23 = TableGetCellBgRect(table,iVar11);
    pIVar6 = local_d8;
    uStack_c0 = extraout_XMM0_Dc_00;
    local_c8._0_4_ = IVar23.Min.x;
    local_c8._4_4_ = IVar23.Min.y;
    uStack_bc = extraout_XMM0_Dd_00;
    local_b8 = IVar23.Max.x;
    fStack_b4 = IVar23.Max.y;
    uStack_b0 = (uint)in_XMM1_Qa;
    uStack_ac = (uint)((ulong)in_XMM1_Qa >> 0x20);
    fVar18 = table->RowMinHeight - (table->CellPaddingY + table->CellPaddingY);
    uVar14 = -(uint)(fVar18 <= (float)local_98._4_4_);
    local_58 = ZEXT416(~uVar14 & (uint)fVar18 | local_98._4_4_ & uVar14);
    local_ec[0] = '\0';
    local_ec[1] = '\0';
    local_ec[2] = '\0';
    local_ec[3] = '\0';
    fVar18 = IVar5.x;
    fVar16 = 0.0;
    fVar17 = 0.0;
    uStack_d0 = 0;
    uStack_cc = 0;
    local_f8 = pIVar4;
    local_80 = IVar5;
    if ((table->Flags & 8) == 0) {
      local_e8 = 0.0;
      uStack_e4 = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
    }
    else if ((column->Flags & 0x200) == 0) {
      local_e8 = (float)(int)(local_d8->FontSize * 0.65 + (local_d8->Style).FramePadding.x);
      uStack_e4 = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      if ('\0' < column->SortOrder) {
        uStack_e4 = 0;
        uStack_e0 = 0;
        uStack_dc = 0;
        local_fc = fVar18;
        ImFormatString(local_ec,4,"%d",(ulong)((byte)column->SortOrder + 1));
        local_9c = (pIVar6->Style).ItemInnerSpacing.x;
        IVar5 = CalcTextSize(local_ec,(char *)0x0,false,-1.0);
        fVar17 = IVar5.y;
        fVar16 = IVar5.x + local_9c;
        uStack_d0 = extraout_XMM0_Dc_01;
        uStack_cc = extraout_XMM0_Dd_01;
        fVar18 = local_fc;
      }
    }
    else {
      local_e8 = 0.0;
      uStack_e4 = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
    }
    fVar18 = (float)local_98._0_4_ + fVar18 + fVar16 + local_e8;
    uVar2 = column->ContentMaxXHeadersUsed;
    uVar3 = column->ContentMaxXHeadersIdeal;
    uVar14 = -(uint)(column->WorkMaxX <= (float)uVar2);
    uVar15 = -(uint)(fVar18 <= (float)uVar3);
    uVar22 = CONCAT44(~uVar15 & (uint)fVar18,~uVar14 & (uint)column->WorkMaxX) |
             CONCAT44(uVar3 & uVar15,uVar2 & uVar14);
    column->ContentMaxXHeadersUsed = (float)(int)uVar22;
    column->ContentMaxXHeadersIdeal = (float)(int)(uVar22 >> 0x20);
    local_d8 = (ImGuiContext *)CONCAT44(fVar17,fVar16);
    if ((table->IsContextPopupOpen == true) && (iVar11 == table->ContextPopupColumn)) {
      bVar13 = table->InstanceInteracted == table->InstanceCurrent;
    }
    else {
      bVar13 = false;
    }
    local_98._0_8_ = pcVar12;
    local_88 = lVar10;
    id = ImGuiWindow::GetID(local_f8,pcVar12,(char *)0x0);
    fVar18 = (pIVar6->Style).CellPadding.y;
    fVar18 = fVar18 + fVar18 + (float)local_c8._4_4_ + (float)local_58._0_4_;
    uVar14 = -(uint)(fVar18 <= fStack_b4);
    local_40.Max.y = (float)(uVar14 & (uint)fStack_b4 | ~uVar14 & (uint)fVar18);
    local_40.Min.x = (float)local_c8._0_4_;
    local_40.Min.y = (float)local_c8._4_4_;
    local_40.Max.x = local_b8;
    local_60.x = 0.0;
    local_60.y = (float)local_58._0_4_;
    ItemSize(&local_60,-1.0);
    bVar7 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar7) {
      bVar7 = ButtonBehavior(&local_40,id,&local_fd,&local_fe,0x1000);
      local_fc = (float)CONCAT31(local_fc._1_3_,bVar7);
      if (pIVar6->ActiveId != id) {
        SetItemAllowOverlap();
      }
      IVar5 = local_80;
      if (((local_fe | local_fd) & 1U) == 0 && !bVar13) {
        iVar11 = (int)local_88;
        if ((table->field_0x90 & 1) == 0) {
          IVar8 = GetColorU32(0x2a,1.0);
          TableSetBgColor(3,IVar8,table->CurrentColumn);
        }
      }
      else {
        uVar14 = 0x1a;
        if (local_fe == false) {
          uVar14 = local_fd & 1 | 0x18;
        }
        IVar8 = GetColorU32(uVar14,1.0);
        TableSetBgColor(3,IVar8,table->CurrentColumn);
        RenderNavHighlight(&local_40,id,10);
        iVar11 = (int)local_88;
      }
      fVar18 = (float)local_d8;
      if (local_fe == false) {
        (local_f8->DC).CursorPos.y =
             (pIVar6->Style).ItemSpacing.y * -0.5 + (local_f8->DC).CursorPos.y;
      }
      else {
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)iVar11;
        (local_f8->DC).CursorPos.y =
             (pIVar6->Style).ItemSpacing.y * -0.5 + (local_f8->DC).CursorPos.y;
        if ((table->Flags & 2) != 0) {
          bVar13 = IsMouseDragging(0,-1.0);
          fVar18 = (float)local_d8;
          if ((bVar13) && (pIVar6->DragDropActive == false)) {
            table->ReorderColumn = (ImGuiTableColumnIdx)iVar11;
            table->InstanceInteracted = table->InstanceCurrent;
            fVar16 = (pIVar6->IO).MouseDelta.x;
            if (fVar16 < 0.0) {
              pIVar1 = &(pIVar6->IO).MousePos;
              if ((pIVar1->x <= (float)local_c8._0_4_ && (float)local_c8._0_4_ != pIVar1->x) &&
                 (column->PrevEnabledColumn != -1)) {
                pIVar9 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&table->Columns,(int)column->PrevEnabledColumn);
                fVar18 = (float)local_d8;
                if ((((pIVar9->Flags | column->Flags) & 0x40U) == 0) &&
                   (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
                    table->FreezeColumnsRequest <= pIVar9->IndexWithinEnabledSet)) {
                  table->ReorderColumnDir = -1;
                }
              }
              fVar16 = (pIVar6->IO).MouseDelta.x;
            }
            if (((0.0 < fVar16) && (local_b8 < (pIVar6->IO).MousePos.x)) &&
               (column->NextEnabledColumn != -1)) {
              pIVar9 = ImSpan<ImGuiTableColumn>::operator[]
                                 (&table->Columns,(int)column->NextEnabledColumn);
              fVar18 = (float)local_d8;
              if ((((pIVar9->Flags | column->Flags) & 0x40U) == 0) &&
                 (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
                  table->FreezeColumnsRequest <= pIVar9->IndexWithinEnabledSet)) {
                table->ReorderColumnDir = '\x01';
              }
            }
          }
        }
      }
      fVar16 = IVar5.y;
      local_b8 = (local_b8 - local_e8) - fVar18;
      if (((table->Flags & 8) != 0) && ((column->Flags & 0x200) == 0)) {
        uVar19 = 0;
        uVar20 = 0;
        uVar21 = 0;
        if (column->SortOrder != -1) {
          uStack_e4 = 0;
          uStack_e0 = 0;
          uStack_dc = 0;
          local_c8._4_4_ = local_c8._4_4_ & (uint)fStack_b4;
          local_c8._0_4_ =
               ~-(uint)(local_b8 <= (float)local_c8._0_4_) & (uint)local_b8 |
               local_c8._0_4_ & -(uint)(local_b8 <= (float)local_c8._0_4_);
          uStack_c0 = uStack_c0 & uStack_b0;
          uStack_bc = uStack_bc & uStack_ac;
          local_e8 = fVar16;
          if ('\0' < column->SortOrder) {
            IVar8 = GetColorU32(0,0.7);
            PushStyleColor(0,IVar8);
            IVar5.y = local_e8;
            IVar5.x = (pIVar6->Style).ItemInnerSpacing.x + (float)local_c8._0_4_;
            RenderText(IVar5,local_ec,(char *)0x0,true);
            PopStyleColor(1);
            local_c8._0_4_ = (float)local_c8._0_4_ + (float)local_d8;
          }
          draw_list = local_f8->DrawList;
          IVar8 = GetColorU32(0,1.0);
          pos.y = local_e8;
          pos.x = (float)local_c8._0_4_;
          RenderArrow(draw_list,pos,IVar8,(column->field_0x64 & 3) == 1 ^ 3,0.65);
          fVar16 = local_e8;
          uVar19 = uStack_e4;
          uVar20 = uStack_e0;
          uVar21 = uStack_dc;
        }
        if ((local_fc._0_1_ != '\0') && (iVar11 != table->ReorderColumn)) {
          local_e8 = fVar16;
          uStack_e4 = uVar19;
          uStack_e0 = uVar20;
          uStack_dc = uVar21;
          sort_direction = TableGetColumnNextSortDirection(column);
          TableSetColumnSortDirection(iVar11,sort_direction,(pIVar6->IO).KeyShift);
          fVar16 = local_e8;
        }
      }
      pcVar12 = local_78;
      local_60.y = (float)local_58._0_4_ + fVar16 + (pIVar6->Style).FramePadding.y;
      local_60.x = local_b8;
      RenderTextEllipsis(local_f8->DrawList,&local_70,&local_60,local_b8,local_b8,
                         (char *)local_98._0_8_,local_78,&local_68);
      if (((local_b8 - local_70.x < local_68.x) && (local_fd == true)) &&
         (pIVar6->TooltipSlowDelay <= pIVar6->HoveredIdNotActiveTimer &&
          pIVar6->HoveredIdNotActiveTimer != pIVar6->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)pcVar12 - local_98._0_4_));
      }
      bVar13 = IsMouseReleased(1);
      if (bVar13) {
        bVar13 = IsItemHovered(0);
        if (bVar13) {
          TableOpenContextMenu(iVar11);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}